

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O2

UniquePtr<EVP_PKEY> MakeTestKey(void)

{
  _Head_base<0UL,_ec_key_st_*,_false> key;
  int iVar1;
  __uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true> in_RDI;
  UniquePtr<EVP_PKEY> evp_pkey;
  UniquePtr<EC_KEY> ec_key;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_18;
  _Head_base<0UL,_ec_key_st_*,_false> local_10;
  
  local_10._M_head_impl = (ec_key_st *)EC_KEY_new_by_curve_name(0x19f);
  if (local_10._M_head_impl != (EC_KEY *)0x0) {
    iVar1 = EC_KEY_generate_key((EC_KEY *)local_10._M_head_impl);
    if (iVar1 != 0) {
      local_18._M_head_impl = (evp_pkey_st *)EVP_PKEY_new();
      key._M_head_impl = local_10._M_head_impl;
      if ((EVP_PKEY *)local_18._M_head_impl == (EVP_PKEY *)0x0) {
LAB_002feb1a:
        *(undefined8 *)
         in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl = 0;
      }
      else {
        local_10._M_head_impl = (EC_KEY *)0x0;
        iVar1 = EVP_PKEY_assign_EC_KEY(local_18._M_head_impl,key._M_head_impl);
        if (iVar1 == 0) goto LAB_002feb1a;
        *(evp_pkey_st **)
         in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl = local_18._M_head_impl;
        local_18._M_head_impl = (evp_pkey_st *)0x0;
      }
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_18);
      goto LAB_002feb26;
    }
  }
  *(undefined8 *)
   in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
   super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
   super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl = 0;
LAB_002feb26:
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_key_st,_bssl::internal::Deleter> *)&local_10);
  return (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         (tuple<evp_pkey_st_*,_bssl::internal::Deleter>)
         in_RDI.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_evp_pkey_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_evp_pkey_st_*,_false>._M_head_impl;
}

Assistant:

static bssl::UniquePtr<EVP_PKEY> MakeTestKey() {
  bssl::UniquePtr<EC_KEY> ec_key(
      EC_KEY_new_by_curve_name(NID_X9_62_prime256v1));
  if (!ec_key ||
      !EC_KEY_generate_key(ec_key.get())) {
    return nullptr;
  }
  bssl::UniquePtr<EVP_PKEY> evp_pkey(EVP_PKEY_new());
  if (!evp_pkey ||
      !EVP_PKEY_assign_EC_KEY(evp_pkey.get(), ec_key.release())) {
    return nullptr;
  }
  return evp_pkey;
}